

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiniscriptIntrinsics.cpp
# Opt level: O2

Value MiniScript::Intrinsics::ListType(void)

{
  anon_union_8_3_2f476f46_for_data extraout_RDX;
  Value *in_RDI;
  Value VVar1;
  ValueDict d;
  Value VStack_138;
  undefined1 local_128 [24];
  FunctionStorage *local_110;
  ValueType local_108;
  String local_100;
  String local_f0;
  String local_e0;
  String local_d0;
  String local_c0;
  String local_b0;
  String local_a0;
  String local_90;
  String local_80;
  String local_70;
  String local_60;
  String local_50;
  String local_40;
  String local_30;
  String local_20;
  
  if (_listType == '\0') {
    local_128._16_8_ = &PTR__Dictionary_00166240;
    local_110 = (FunctionStorage *)0x0;
    local_108 = Null;
    Value::Value(&VStack_138,"hasIndex");
    String::String(&local_20,"hasIndex");
    Intrinsic::GetByName(&local_20);
    Intrinsic::GetFunc((Intrinsic *)local_128);
    Dictionary<MiniScript::Value,_MiniScript::Value,_&MiniScript::HashValue>::SetValue
              ((Dictionary<MiniScript::Value,_MiniScript::Value,_&MiniScript::HashValue> *)
               (local_128 + 0x10),&VStack_138,(Value *)local_128);
    Value::~Value((Value *)local_128);
    String::~String(&local_20);
    Value::~Value(&VStack_138);
    Value::Value(&VStack_138,"indexes");
    String::String(&local_30,"indexes");
    Intrinsic::GetByName(&local_30);
    Intrinsic::GetFunc((Intrinsic *)local_128);
    Dictionary<MiniScript::Value,_MiniScript::Value,_&MiniScript::HashValue>::SetValue
              ((Dictionary<MiniScript::Value,_MiniScript::Value,_&MiniScript::HashValue> *)
               (local_128 + 0x10),&VStack_138,(Value *)local_128);
    Value::~Value((Value *)local_128);
    String::~String(&local_30);
    Value::~Value(&VStack_138);
    Value::Value(&VStack_138,"indexOf");
    String::String(&local_40,"indexOf");
    Intrinsic::GetByName(&local_40);
    Intrinsic::GetFunc((Intrinsic *)local_128);
    Dictionary<MiniScript::Value,_MiniScript::Value,_&MiniScript::HashValue>::SetValue
              ((Dictionary<MiniScript::Value,_MiniScript::Value,_&MiniScript::HashValue> *)
               (local_128 + 0x10),&VStack_138,(Value *)local_128);
    Value::~Value((Value *)local_128);
    String::~String(&local_40);
    Value::~Value(&VStack_138);
    Value::Value(&VStack_138,"insert");
    String::String(&local_50,"insert");
    Intrinsic::GetByName(&local_50);
    Intrinsic::GetFunc((Intrinsic *)local_128);
    Dictionary<MiniScript::Value,_MiniScript::Value,_&MiniScript::HashValue>::SetValue
              ((Dictionary<MiniScript::Value,_MiniScript::Value,_&MiniScript::HashValue> *)
               (local_128 + 0x10),&VStack_138,(Value *)local_128);
    Value::~Value((Value *)local_128);
    String::~String(&local_50);
    Value::~Value(&VStack_138);
    Value::Value(&VStack_138,"join");
    String::String(&local_60,"join");
    Intrinsic::GetByName(&local_60);
    Intrinsic::GetFunc((Intrinsic *)local_128);
    Dictionary<MiniScript::Value,_MiniScript::Value,_&MiniScript::HashValue>::SetValue
              ((Dictionary<MiniScript::Value,_MiniScript::Value,_&MiniScript::HashValue> *)
               (local_128 + 0x10),&VStack_138,(Value *)local_128);
    Value::~Value((Value *)local_128);
    String::~String(&local_60);
    Value::~Value(&VStack_138);
    Value::Value(&VStack_138,"len");
    String::String(&local_70,"len");
    Intrinsic::GetByName(&local_70);
    Intrinsic::GetFunc((Intrinsic *)local_128);
    Dictionary<MiniScript::Value,_MiniScript::Value,_&MiniScript::HashValue>::SetValue
              ((Dictionary<MiniScript::Value,_MiniScript::Value,_&MiniScript::HashValue> *)
               (local_128 + 0x10),&VStack_138,(Value *)local_128);
    Value::~Value((Value *)local_128);
    String::~String(&local_70);
    Value::~Value(&VStack_138);
    Value::Value(&VStack_138,"pop");
    String::String(&local_80,"pop");
    Intrinsic::GetByName(&local_80);
    Intrinsic::GetFunc((Intrinsic *)local_128);
    Dictionary<MiniScript::Value,_MiniScript::Value,_&MiniScript::HashValue>::SetValue
              ((Dictionary<MiniScript::Value,_MiniScript::Value,_&MiniScript::HashValue> *)
               (local_128 + 0x10),&VStack_138,(Value *)local_128);
    Value::~Value((Value *)local_128);
    String::~String(&local_80);
    Value::~Value(&VStack_138);
    Value::Value(&VStack_138,"pull");
    String::String(&local_90,"pull");
    Intrinsic::GetByName(&local_90);
    Intrinsic::GetFunc((Intrinsic *)local_128);
    Dictionary<MiniScript::Value,_MiniScript::Value,_&MiniScript::HashValue>::SetValue
              ((Dictionary<MiniScript::Value,_MiniScript::Value,_&MiniScript::HashValue> *)
               (local_128 + 0x10),&VStack_138,(Value *)local_128);
    Value::~Value((Value *)local_128);
    String::~String(&local_90);
    Value::~Value(&VStack_138);
    Value::Value(&VStack_138,"push");
    String::String(&local_a0,"push");
    Intrinsic::GetByName(&local_a0);
    Intrinsic::GetFunc((Intrinsic *)local_128);
    Dictionary<MiniScript::Value,_MiniScript::Value,_&MiniScript::HashValue>::SetValue
              ((Dictionary<MiniScript::Value,_MiniScript::Value,_&MiniScript::HashValue> *)
               (local_128 + 0x10),&VStack_138,(Value *)local_128);
    Value::~Value((Value *)local_128);
    String::~String(&local_a0);
    Value::~Value(&VStack_138);
    Value::Value(&VStack_138,"shuffle");
    String::String(&local_b0,"shuffle");
    Intrinsic::GetByName(&local_b0);
    Intrinsic::GetFunc((Intrinsic *)local_128);
    Dictionary<MiniScript::Value,_MiniScript::Value,_&MiniScript::HashValue>::SetValue
              ((Dictionary<MiniScript::Value,_MiniScript::Value,_&MiniScript::HashValue> *)
               (local_128 + 0x10),&VStack_138,(Value *)local_128);
    Value::~Value((Value *)local_128);
    String::~String(&local_b0);
    Value::~Value(&VStack_138);
    Value::Value(&VStack_138,"sort");
    String::String(&local_c0,"sort");
    Intrinsic::GetByName(&local_c0);
    Intrinsic::GetFunc((Intrinsic *)local_128);
    Dictionary<MiniScript::Value,_MiniScript::Value,_&MiniScript::HashValue>::SetValue
              ((Dictionary<MiniScript::Value,_MiniScript::Value,_&MiniScript::HashValue> *)
               (local_128 + 0x10),&VStack_138,(Value *)local_128);
    Value::~Value((Value *)local_128);
    String::~String(&local_c0);
    Value::~Value(&VStack_138);
    Value::Value(&VStack_138,"sum");
    String::String(&local_d0,"sum");
    Intrinsic::GetByName(&local_d0);
    Intrinsic::GetFunc((Intrinsic *)local_128);
    Dictionary<MiniScript::Value,_MiniScript::Value,_&MiniScript::HashValue>::SetValue
              ((Dictionary<MiniScript::Value,_MiniScript::Value,_&MiniScript::HashValue> *)
               (local_128 + 0x10),&VStack_138,(Value *)local_128);
    Value::~Value((Value *)local_128);
    String::~String(&local_d0);
    Value::~Value(&VStack_138);
    Value::Value(&VStack_138,"remove");
    String::String(&local_e0,"remove");
    Intrinsic::GetByName(&local_e0);
    Intrinsic::GetFunc((Intrinsic *)local_128);
    Dictionary<MiniScript::Value,_MiniScript::Value,_&MiniScript::HashValue>::SetValue
              ((Dictionary<MiniScript::Value,_MiniScript::Value,_&MiniScript::HashValue> *)
               (local_128 + 0x10),&VStack_138,(Value *)local_128);
    Value::~Value((Value *)local_128);
    String::~String(&local_e0);
    Value::~Value(&VStack_138);
    Value::Value(&VStack_138,"replace");
    String::String(&local_f0,"replace");
    Intrinsic::GetByName(&local_f0);
    Intrinsic::GetFunc((Intrinsic *)local_128);
    Dictionary<MiniScript::Value,_MiniScript::Value,_&MiniScript::HashValue>::SetValue
              ((Dictionary<MiniScript::Value,_MiniScript::Value,_&MiniScript::HashValue> *)
               (local_128 + 0x10),&VStack_138,(Value *)local_128);
    Value::~Value((Value *)local_128);
    String::~String(&local_f0);
    Value::~Value(&VStack_138);
    Value::Value(&VStack_138,"values");
    String::String(&local_100,"values");
    Intrinsic::GetByName(&local_100);
    Intrinsic::GetFunc((Intrinsic *)local_128);
    Dictionary<MiniScript::Value,_MiniScript::Value,_&MiniScript::HashValue>::SetValue
              ((Dictionary<MiniScript::Value,_MiniScript::Value,_&MiniScript::HashValue> *)
               (local_128 + 0x10),&VStack_138,(Value *)local_128);
    Value::~Value((Value *)local_128);
    String::~String(&local_100);
    Value::~Value(&VStack_138);
    Value::Value(&VStack_138,(ValueDict *)(local_128 + 0x10));
    Value::operator=((Value *)&_listType,&VStack_138);
    Value::~Value(&VStack_138);
    Dictionary<MiniScript::Value,_MiniScript::Value,_&MiniScript::HashValue>::~Dictionary
              ((Dictionary<MiniScript::Value,_MiniScript::Value,_&MiniScript::HashValue> *)
               (local_128 + 0x10));
  }
  Value::Value(in_RDI,(Value *)&_listType);
  VVar1.data.number = extraout_RDX.number;
  VVar1._0_8_ = in_RDI;
  return VVar1;
}

Assistant:

Value Intrinsics::ListType() {
		if (_listType.IsNull()) {
			ValueDict d;
			d.SetValue("hasIndex", Intrinsic::GetByName("hasIndex")->GetFunc());
			d.SetValue("indexes", Intrinsic::GetByName("indexes")->GetFunc());
			d.SetValue("indexOf",  Intrinsic::GetByName("indexOf")->GetFunc());
			d.SetValue("insert",  Intrinsic::GetByName("insert")->GetFunc());
			d.SetValue("join",  Intrinsic::GetByName("join")->GetFunc());
			d.SetValue("len",  Intrinsic::GetByName("len")->GetFunc());
			d.SetValue("pop",  Intrinsic::GetByName("pop")->GetFunc());
			d.SetValue("pull",  Intrinsic::GetByName("pull")->GetFunc());
			d.SetValue("push",  Intrinsic::GetByName("push")->GetFunc());
			d.SetValue("shuffle",  Intrinsic::GetByName("shuffle")->GetFunc());
			d.SetValue("sort",  Intrinsic::GetByName("sort")->GetFunc());
			d.SetValue("sum",  Intrinsic::GetByName("sum")->GetFunc());
			d.SetValue("remove",  Intrinsic::GetByName("remove")->GetFunc());
			d.SetValue("replace",  Intrinsic::GetByName("replace")->GetFunc());
			d.SetValue("values",  Intrinsic::GetByName("values")->GetFunc());
			_listType = d;
		}
		return _listType;
	}